

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_long,void>
          (XmlWriter *this,StringRef name,unsigned_long *attribute)

{
  StringRef attribute_00;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  ReusableStringStream rss;
  ReusableStringStream local_58;
  long *local_48;
  size_type local_40;
  long local_38 [2];
  
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
  local_58.m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_58.m_oss =
       (ostream *)
       (pSVar1->super_StringStreams).m_streams.
       super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar2].m_ptr;
  std::ostream::_M_insert<unsigned_long>((ulong)local_58.m_oss);
  std::__cxx11::stringbuf::str();
  attribute_00.m_size = local_40;
  attribute_00.m_start = (char *)local_48;
  writeAttribute(this,name,attribute_00);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_58);
  return this;
}

Assistant:

XmlWriter& writeAttribute( StringRef name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }